

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Parser::Parser(Parser *this,TokenList *tokens,bool is_binary)

{
  const_iterator cVar1;
  Scope *this_00;
  bool is_binary_local;
  TokenList *tokens_local;
  Parser *this_local;
  
  this->tokens = tokens;
  this->last = (TokenPtr)0x0;
  this->current = (TokenPtr)0x0;
  cVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          begin(tokens);
  (this->cursor)._M_current = cVar1._M_current;
  std::unique_ptr<Assimp::FBX::Scope,std::default_delete<Assimp::FBX::Scope>>::
  unique_ptr<std::default_delete<Assimp::FBX::Scope>,void>
            ((unique_ptr<Assimp::FBX::Scope,std::default_delete<Assimp::FBX::Scope>> *)&this->root);
  this->is_binary = is_binary;
  this_00 = (Scope *)operator_new(0x30);
  Scope::Scope(this_00,this,true);
  std::unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::reset
            (&this->root,this_00);
  return;
}

Assistant:

Parser::Parser (const TokenList& tokens, bool is_binary)
: tokens(tokens)
, last()
, current()
, cursor(tokens.begin())
, is_binary(is_binary)
{
    root.reset(new Scope(*this,true));
}